

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O3

double testKalmanFilterZeroInput(void)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  Scalar SVar6;
  double dVar7;
  double *pdVar8;
  Index IVar9;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar10;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar11;
  undefined8 *puVar12;
  Index index;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  Scalar *pSVar17;
  ActualDstType actualDst;
  Index size;
  undefined4 uVar18;
  undefined4 uVar19;
  MeasureVector w;
  StateVector x;
  Pmatrix p;
  StateVector xh;
  Qmatrix q1;
  type tmp;
  StateVector error;
  Rmatrix r;
  Cmatrix c;
  Rmatrix r1;
  InputVector u;
  Qmatrix q;
  Dmatrix d;
  Bmatrix b;
  Matrix<double,_4,_4,_0,_4,_4> a;
  filter f;
  StateVector xk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  long local_aa28;
  DenseStorage<double,__1,__1,_1,_0> local_aa20;
  scalar_sum_op<double,_double> local_aa09;
  DenseStorage<double,__1,__1,_1,_0> local_aa08;
  Matrix<double,__1,__1,_0,__1,__1> local_a9f8;
  undefined1 *local_a9e0;
  long local_a9d8;
  Matrix<double,__1,__1,_0,__1,__1> local_a9d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a9b8;
  DenseStorage<double,__1,__1,_1,_0> local_a998;
  double local_a988;
  double dStack_a980;
  double *local_a978;
  DenseStorage<double,__1,__1,_1,_0> *local_a960;
  long local_a958;
  Matrix<double,__1,__1,_0,__1,__1> local_a950;
  DenseStorage<double,__1,__1,_1,_0> local_a938;
  ulong local_a928;
  Matrix<double,__1,__1,_0,__1,__1> local_a920;
  code *local_a908;
  undefined8 local_a900;
  long local_a8f8;
  undefined1 *local_a8f0 [2];
  void *local_a8e0 [3];
  void *local_a8c8 [3];
  void *local_a8b0 [3];
  Matrix<double,_4,_4,_0,_4,_4> local_a898;
  code *local_a810 [30];
  undefined8 local_a720;
  void *local_a578;
  undefined8 uStack_a570;
  undefined8 local_a568;
  void *pvStack_a560;
  Matrix<double,_4,_4,_0,_4,_4> *local_a558 [2];
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_a548 [500];
  DenseStorage<double,__1,__1,_1,_0> local_66c8;
  Scalar local_66b8 [2001];
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_2830;
  
  stateObservation::KalmanFilterBase::KalmanFilterBase((KalmanFilterBase *)local_a810,4,3,0);
  local_a908 = stateObservation::KalmanFilterBase::setR;
  local_a810[0] = stateObservation::KalmanFilterBase::setR;
  local_a900 = 0x11f2e0;
  local_a720 = 0x11f2e0;
  local_a578 = (void *)0x0;
  uStack_a570 = 0;
  local_a568 = 0;
  pvStack_a560 = (void *)0x0;
  local_a558[0] = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  local_a558[1] = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  local_a548[0].m_xpr = &local_a898;
  local_a548[0].m_row = 0;
  local_a548[0].m_col = 1;
  local_a548[0].m_currentBlockRows = 1;
  local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = -0.6785714;
  local_66b8[0] = 0.1156463;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (local_a548,local_66b8);
  local_2830.i = 0x298d9804;
  local_2830._4_4_ = 0x3fdc1cb3;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_2830);
  local_a9b8.m_lhs.m_lhs = (Matrix<double,__1,__1,_0,__1,__1> *)0x3fd2544a04301069;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_a9b8);
  local_a8b0[0] = (void *)0x3fb626de911a6f17;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)local_a8b0);
  local_a938.m_data = (double *)0xbf9c09c3ce2089e3;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_a938);
  local_a8c8[0] = (void *)0x3fd578ffc61e5ce2;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)local_a8c8);
  local_a920.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f92db61bb05faec;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_a920);
  local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0xbfdab4b28f33e50a;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_a9d0);
  local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0xbfca11f926c7eae6;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_a950);
  local_a8e0[0] = (void *)0xbfdc60b044000a11;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)local_a8e0);
  local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&DAT_bfd1111134dba9df;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_a9f8);
  local_aa20.m_data = (double *)&DAT_3fdae264e48626f6;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_aa20);
  local_aa08.m_data = (double *)&DAT_3fe13d1782d38477;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)&local_aa08);
  local_a8f0[0] = &DAT_3fdf4168eb7be47d;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar10,(Scalar *)local_a8f0);
  local_a9e0 = &DAT_bfe3280cf9e3864d;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
            (pCVar10,(Scalar *)&local_a9e0);
  if ((local_a548[0].m_row + local_a548[0].m_currentBlockRows != 4) || (local_a548[0].m_col != 4)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
                 );
  }
  stateObservation::LinearKalmanFilter::getBmatrixRandom();
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  stateObservation::LinearKalmanFilter::getDmatrixRandom();
  memset(local_a548,0,0x3e90);
  memset(local_66b8,0,16000);
  stateObservation::ObserverBase::stateVectorZero();
  IVar9 = local_aa08.m_rows;
  pdVar8 = local_aa08.m_data;
  if (local_a548[0].m_row != local_aa08.m_rows) {
    if (local_aa08.m_rows < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    free(local_a548[0].m_xpr);
    if (IVar9 == 0) {
      pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
    }
    else {
      if ((ulong)IVar9 >> 0x3d != 0) {
LAB_00108c71:
        puVar12 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar12 = operator_delete;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)malloc(IVar9 * 8);
      if (IVar9 != 1 && ((ulong)pMVar11 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pMVar11 == (Matrix<double,_4,_4,_0,_4,_4> *)0x0) goto LAB_00108c71;
    }
    local_a548[0].m_row = IVar9;
    local_a548[0].m_xpr = pMVar11;
  }
  uVar13 = IVar9 - (IVar9 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < IVar9) {
    lVar15 = 0;
    do {
      pdVar2 = (double *)((undefined1 *)pdVar8 + lVar15 * 8);
      dVar5 = pdVar2[1];
      pdVar1 = ((local_a548[0].m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
               .m_storage.m_data.array + lVar15;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar5;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)uVar13);
  }
  if ((long)uVar13 < IVar9) {
    do {
      ((local_a548[0].m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[uVar13] = *(double *)((undefined1 *)pdVar8 + uVar13 * 8);
      uVar13 = uVar13 + 1;
    } while (IVar9 != uVar13);
  }
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
            (&local_2830,
             &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  if (-1 < (local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols | local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows)) {
    local_a9b8.m_lhs.m_rhs =
         (RhsNested)
         local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    local_a9b8.m_rhs =
         (RhsNested)
         local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols;
    local_a9b8._24_8_ = 0x3f847ae147ae147b;
    local_a9b8.m_lhs.m_lhs = &local_a9d0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a920,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_a9b8);
    free(local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    stateObservation::KalmanFilterBase::getQmatrixRandom();
    if (-1 < (local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols | local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)) {
      local_a9b8.m_lhs.m_rhs =
           (RhsNested)
           local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_a9b8.m_rhs =
           (RhsNested)
           local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_a9b8._24_8_ = 0x3f847ae147ae147b;
      local_a9b8.m_lhs.m_lhs = &local_a950;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a9d0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_a9b8);
      free(local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_a9b8.m_lhs.m_lhs = &local_a920;
      local_a9b8.m_lhs.m_rhs = (RhsNested)local_a9b8.m_lhs.m_lhs;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_a950,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_a9b8);
      local_a9b8.m_lhs.m_lhs = &local_a9d0;
      local_a9b8.m_lhs.m_rhs = (RhsNested)local_a9b8.m_lhs.m_lhs;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_a8e0,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_a9b8);
      stateObservation::ObserverBase::inputVectorZero();
      local_aa28 = 1;
      do {
        stateObservation::ObserverBase::stateVectorZero();
        uVar16 = 0;
        while( true ) {
          lVar15 = stateObservation::ObserverBase::getStateSize();
          uVar13 = (ulong)uVar16;
          if (lVar15 <= (long)uVar13) break;
          dVar5 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_a9b8,&local_2830);
          if (local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows <= (long)uVar13) goto LAB_0010956c;
          local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[uVar13] = dVar5 + 0.0;
          uVar16 = uVar16 + 1;
        }
        if (local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows) {
LAB_0010958b:
          pcVar14 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
          ;
LAB_001095ce:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar14);
        }
        local_a9b8.m_lhs.m_lhs = &local_a9d0;
        local_a9b8.m_lhs.m_rhs = (RhsNested)&local_a9f8;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_a9f8,&local_a9b8.m_lhs,
                   (assign_op<double,_double> *)&local_aa20,(type)0x0);
        stateObservation::ObserverBase::measureVectorZero();
        uVar16 = 0;
        while( true ) {
          lVar15 = stateObservation::ObserverBase::getMeasureSize();
          uVar13 = (ulong)uVar16;
          if (lVar15 <= (long)uVar13) break;
          dVar5 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_a9b8,&local_2830);
          if (local_aa20.m_rows <= (long)uVar13) goto LAB_0010956c;
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_aa20.m_data)->
            m_storage).m_data)[uVar13] = (double *)(dVar5 + 0.0);
          uVar16 = uVar16 + 1;
        }
        if (local_a920.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_aa20.m_rows) goto LAB_0010958b;
        local_a9b8.m_lhs.m_lhs = &local_a920;
        local_a9b8.m_lhs.m_rhs = (RhsNested)&local_aa20;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_aa20,&local_a9b8.m_lhs,
                   (assign_op<double,_double> *)&local_a9e0,(type)0x0);
        pdVar8 = local_aa08.m_data;
        if (local_aa08.m_rows != 4) {
          pcVar14 = 
          "Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 4, 4>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
          ;
          goto LAB_001095ce;
        }
        if ((RhsNested)
            local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows != (RhsNested)0x4) {
          pcVar14 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_001095ed;
        }
        local_a9b8.m_rhs = (RhsNested)&local_a998;
        dVar5 = *(double *)(*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) + 8) *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xc] +
                *(double *)*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[8] +
                *(double *)((undefined1 *)local_aa08.m_data + 8) *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[4] +
                *(double *)(undefined1 *)local_aa08.m_data *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0];
        dVar7 = *(double *)(*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) + 8) *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd] +
                *(double *)*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[9] +
                *(double *)((undefined1 *)local_aa08.m_data + 8) *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[5] +
                *(double *)(undefined1 *)local_aa08.m_data *
                local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1];
        local_a998.m_rows._0_4_ = SUB84(dVar7,0);
        local_a998.m_data = (double *)dVar5;
        local_a998.m_rows._4_4_ = (int)((ulong)dVar7 >> 0x20);
        local_a988 = *(double *)(*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) + 8) *
                     local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[0xe] +
                     *(double *)*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) *
                     local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[10] +
                     *(double *)((undefined1 *)local_aa08.m_data + 8) *
                     local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[6] +
                     *(double *)(undefined1 *)local_aa08.m_data *
                     local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[2];
        dStack_a980 = *(double *)(*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) + 8) *
                      local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xf] +
                      *(double *)*(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) *
                      local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xb] +
                      *(double *)((undefined1 *)local_aa08.m_data + 8) *
                      local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[7] +
                      *(double *)(undefined1 *)local_aa08.m_data *
                      local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[3];
        local_a978 = local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
        auVar3._8_4_ = SUB84(dVar7 + local_a9f8.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data[1],0);
        auVar3._0_8_ = dVar5 + *local_a9f8.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data;
        auVar3._12_4_ =
             (int)((ulong)(dVar7 + local_a9f8.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data[1]) >> 0x20);
        *(undefined1 (*) [16])local_aa08.m_data = auVar3;
        auVar4._8_4_ = SUB84(dStack_a980 +
                             local_a9f8.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data[3],0);
        auVar4._0_8_ = local_a988 +
                       local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data[2];
        auVar4._12_4_ =
             (int)((ulong)(dStack_a980 +
                          local_a9f8.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data[3]) >> 0x20);
        *(undefined1 (*) [16])((long)local_aa08.m_data + 0x10) = auVar4;
        local_a8f8 = local_aa28 * 0x10;
        if (((&local_a548[0].m_row)[local_aa28 * 2] != 4) &&
           (Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<double,__1,__1,_1,_0> *)(&local_a548[0].m_xpr + local_aa28 * 2)
                       ,4,4,1), (&local_a548[0].m_row)[local_aa28 * 2] != 4)) {
          pcVar14 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
          ;
          goto LAB_0010964a;
        }
        pdVar2 = ((DenseStorage<double,__1,__1,_1,_0> *)(&local_a548[0].m_xpr + local_aa28 * 2))->
                 m_data;
        lVar15 = 0;
        do {
          dVar5 = *(double *)((long)((undefined1 *)pdVar8 + lVar15 * 8) + 8);
          pdVar1 = pdVar2 + lVar15;
          *pdVar1 = *(double *)((undefined1 *)pdVar8 + lVar15 * 8);
          pdVar1[1] = dVar5;
          lVar15 = lVar15 + 2;
        } while (lVar15 < 4);
        if (local_a928 != local_aa08.m_rows) goto LAB_0010958b;
        local_a9b8.m_lhs.m_lhs = (LhsNested)&local_a938;
        local_a9b8.m_lhs.m_rhs = (RhsNested)&local_aa08;
        local_a9b8.m_rhs = (RhsNested)&local_aa20;
        if (local_a938.m_rows != local_aa20.m_rows) {
          pcVar14 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_001095ed;
        }
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)((long)&local_66c8.m_data + local_a8f8),
                   &local_a9b8,(assign_op<double,_double> *)&local_a9e0);
        free(local_aa20.m_data);
        free(local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        local_aa28 = local_aa28 + 1;
      } while (local_aa28 != 0x3e9);
      stateObservation::ObserverBase::stateVectorRandom();
      stateObservation::ZeroDelayObserver::setState((Matrix *)local_a810,(long)&local_a9e0);
      stateObservation::KalmanFilterBase::getPmatrixZero();
      for (uVar13 = 0; lVar15 = stateObservation::ObserverBase::getStateSize(),
          (long)uVar13 < lVar15; uVar13 = (ulong)((int)uVar13 + 1)) {
        if (local_a9d8 <= (long)uVar13) {
LAB_0010956c:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        if ((local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows <= (long)uVar13) ||
           (local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= (long)uVar13)) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows * uVar13 + uVar13] = *(double *)(local_a9e0 + uVar13 * 8);
      }
      local_aa20.m_data = (double *)&local_a9f8;
      local_aa20.m_rows = (Index)&local_a9f8;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_a9b8,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_aa20);
      pSVar17 = local_66b8;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_a9f8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_a9b8,
                 (assign_op<double,_double> *)&local_a960);
      free(local_a9b8.m_lhs.m_lhs);
      stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)local_a810);
      local_a9b8.m_lhs.m_lhs = (LhsNested)0x0;
      local_a9b8.m_lhs.m_rhs = (RhsNested)0x0;
      local_a9b8.m_rhs = (RhsNested)0x0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_a9b8,0x10,4,4);
      if ((((DenseStorage<double,__1,__1,_1,_0> *)local_a9b8.m_lhs.m_rhs !=
            (DenseStorage<double,__1,__1,_1,_0> *)0x4) ||
          ((DenseStorage<double,__1,__1,_1,_0> *)local_a9b8.m_rhs !=
           (DenseStorage<double,__1,__1,_1,_0> *)0x4)) &&
         ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                     ((DenseStorage<double,__1,__1,__1,_0> *)&local_a9b8,0x10,4,4),
          (DenseStorage<double,__1,__1,_1,_0> *)local_a9b8.m_lhs.m_rhs !=
          (DenseStorage<double,__1,__1,_1,_0> *)0x4 ||
          ((DenseStorage<double,__1,__1,_1,_0> *)local_a9b8.m_rhs !=
           (DenseStorage<double,__1,__1,_1,_0> *)0x4)))) {
        pcVar14 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
        ;
LAB_0010964a:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar14);
      }
      uVar13 = 0xfffffffffffffffe;
      do {
        dVar5 = local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[uVar13 + 3];
        (&((DenseStorage<double,__1,__1,_1,_0> *)((long)local_a9b8.m_lhs.m_lhs + 0x10))->m_data)
        [uVar13] = (double *)
                   local_a898.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                   .m_data.array[uVar13 + 2];
        (&((DenseStorage<double,__1,__1,_1,_0> *)((long)local_a9b8.m_lhs.m_lhs + 0x10))->m_data +
        uVar13)[1] = (double *)dVar5;
        uVar13 = uVar13 + 2;
      } while (uVar13 < 0xe);
      stateObservation::KalmanFilterBase::setA((Matrix *)local_a810);
      free(local_a9b8.m_lhs.m_lhs);
      stateObservation::LinearKalmanFilter::setB((Matrix *)local_a810);
      stateObservation::KalmanFilterBase::setC((Matrix *)local_a810);
      stateObservation::LinearKalmanFilter::setD((Matrix *)local_a810);
      stateObservation::KalmanFilterBase::setR((Matrix *)local_a810);
      stateObservation::KalmanFilterBase::setQ((Matrix *)local_a810);
      lVar15 = 1;
      do {
        stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)local_a810,(long)pSVar17);
        lVar15 = lVar15 + 1;
        pSVar17 = pSVar17 + 2;
      } while (lVar15 != 0x3e9);
      stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_aa20);
      local_a9b8.m_lhs.m_rhs = (RhsNested)&local_66c8;
      local_a9b8.m_lhs.m_lhs = (LhsNested)&local_aa20;
      if (local_aa20.m_rows == local_66c8.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a960,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_a9b8);
        free(local_aa20.m_data);
        local_aa20.m_data = (double *)&local_a960;
        if (local_a958 == 0) {
          uVar18 = 0;
          uVar19 = 0;
        }
        else {
          if (local_a958 < 1) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                         );
          }
          local_a9b8.m_lhs.m_rhs = (RhsNested)local_a960;
          SVar6 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                  ::
                  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                            ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&local_a9b8,&local_aa09,
                             (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              *)&local_aa20);
          uVar18 = SUB84(SVar6,0);
          uVar19 = (undefined4)((ulong)SVar6 >> 0x20);
        }
        free(local_a960);
        free(local_a9f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_a9e0);
        free(local_a8f0[0]);
        free(local_a8e0[0]);
        free(local_a950.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_a9d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_a920.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_aa08.m_data);
        lVar15 = 16000;
        do {
          free(*(void **)((long)&local_66c8.m_data + lVar15));
          lVar15 = lVar15 + -0x10;
        } while (lVar15 != 0);
        lVar15 = 0x3e90;
        do {
          free(*(void **)((long)local_a558 + lVar15));
          lVar15 = lVar15 + -0x10;
        } while (lVar15 != 0);
        free(local_a8c8[0]);
        free(local_a938.m_data);
        free(local_a8b0[0]);
        local_a810[0] = local_a908;
        local_a720 = local_a900;
        free(pvStack_a560);
        free(local_a578);
        stateObservation::KalmanFilterBase::~KalmanFilterBase((KalmanFilterBase *)local_a810);
        return SQRT((double)CONCAT44(uVar19,uVar18));
      }
      pcVar14 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
LAB_001095ed:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar14);
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

double testKalmanFilterZeroInput()
{
  typedef stateObservation::LinearKalmanFilter filter;

  filter f(4, 3);
  Eigen::Matrix<double, 4, 4> a;

  a << -0.6785714, 0.1156463, 0.4392517, 0.2863946, 0.0865306, -0.0273810, 0.3355102, 0.0184150, -0.4172789, -0.2036735,
      -0.4434014, -0.2666667, 0.4200680, 0.5387075, 0.4883673, -0.598639;

  filter::Bmatrix b = f.getBmatrixRandom();
  filter::Cmatrix c = f.getCmatrixRandom();
  filter::Dmatrix d = f.getDmatrixRandom();

  const stateObservation::Index kmax = 1000;

  filter::StateVector xk[kmax + 1];
  filter::MeasureVector yk[kmax];

  filter::StateVector x = f.stateVectorZero();

  xk[0] = x;

  boost::lagged_fibonacci1279 gen_;

  filter::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  filter::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  filter::Rmatrix r(r1 * r1.transpose());
  filter::Qmatrix q(q1 * q1.transpose());

  filter::InputVector u = f.inputVectorZero();

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {

    filter::StateVector v = f.stateVectorZero();
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    filter::MeasureVector w = f.measureVectorZero();
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    xk[k] = x = a * x + v;
    yk[k - 1] = c * x + w;
  }

  filter::StateVector xh = f.stateVectorRandom();

  f.setState(xh, 0);

  filter::Pmatrix p = f.getPmatrixZero();

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  f.setStateCovariance(p);

  f.setA(a);
  f.setB(b);
  f.setC(c);
  f.setD(d);

  f.setR(r);
  f.setQ(q);

  stateObservation::Index i;

  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);
  }

  filter::StateVector error = f.getEstimatedState(kmax) - xk[kmax];

  return error.norm();
}